

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::TypedExpectation<ot::commissioner::Error_(ot::commissioner::SecurityPolicy_&)>::
Matches(TypedExpectation<ot::commissioner::Error_(ot::commissioner::SecurityPolicy_&)> *this,
       ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<ot::commissioner::SecurityPolicy&>>,std::tuple<ot::commissioner::SecurityPolicy&>>
                    ((tuple<testing::Matcher<ot::commissioner::SecurityPolicy_&>_> *)(this + 0xf0),
                     args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<ot::commissioner::SecurityPolicy_&>_&>::Matches
                      ((MatcherBase<const_std::tuple<ot::commissioner::SecurityPolicy_&>_&> *)
                       (this + 0x108),args);
    return bVar1;
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }